

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polysolver.h
# Opt level: O2

vector<double,_std::allocator<double>_> *
Poly_Solver::poly_solve
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *v,double l,double r,double eps)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  pointer pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  iterator __begin3;
  double *pdVar6;
  iterator __begin2;
  double *pdVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  double dVar15;
  double dVar16;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 extraout_var [56];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  allocator_type local_c1;
  double g;
  double local_b8;
  double local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  vector<double,_std::allocator<double>_> nx;
  vector<double,_std::allocator<double>_> dv;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_b8 = r;
  local_b0 = l;
  if ((poly_solve(std::vector<double,std::allocator<double>>,double,double,double)::rng == '\0') &&
     (iVar9 = __cxa_guard_acquire(&poly_solve(std::vector<double,std::allocator<double>>,double,double,double)
                                   ::rng), iVar9 != 0)) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(&poly_solve::rng);
    __cxa_guard_release(&poly_solve(std::vector<double,std::allocator<double>>,double,double,double)
                         ::rng);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar4 = local_b8 - local_b0;
  uVar10 = 0;
  dv.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = 0;
  dv.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dv.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_a0 = __return_storage_ptr__;
  do {
    pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar6 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)pdVar2 - (long)pdVar6) < 9) break;
    auVar13 = ZEXT816(0) << 0x40;
    pdVar7 = pdVar6;
    while (pdVar7 != pdVar2) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *pdVar7;
      pdVar7 = pdVar7 + 1;
      auVar12._8_8_ = 0x7fffffffffffffff;
      auVar12._0_8_ = 0x7fffffffffffffff;
      auVar12 = vandpd_avx512vl(auVar19,auVar12);
      auVar13 = vmaxsd_avx(auVar12,auVar13);
    }
    dVar15 = auVar13._0_8_;
    if ((dVar15 != 0.0) || (NAN(dVar15))) {
      for (; pdVar6 != pdVar2; pdVar6 = pdVar6 + 1) {
        *pdVar6 = *pdVar6 / dVar15;
      }
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,v);
    de((vector<double,_std::allocator<double>_> *)&local_48);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&dv,&nx.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&nx.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    fVar14 = randf(&poly_solve::rng);
    auVar20._0_8_ = (double)fVar14;
    auVar20._8_8_ = extraout_XMM0_Qb;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_b0;
    uVar10 = uVar10 + 1;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar4;
    auVar13 = vfmadd132sd_fma(auVar20,auVar17,auVar13);
    auVar22 = ZEXT1664(auVar13);
    g = auVar13._0_8_;
    if (uVar10 % 5 == 1) {
      auVar22 = ZEXT864((ulong)local_b8);
      g = local_b8;
    }
    else if (uVar10 % 5 == 0) {
      g = local_b0;
      auVar22 = ZEXT1664(auVar17);
    }
    iVar11 = 0x1f;
    while( true ) {
      dVar15 = auVar22._0_8_;
      iVar11 = iVar11 + -1;
      if (iVar11 == 0) break;
      local_a8 = dVar15;
      dVar15 = poly_calc(v,dVar15);
      dVar16 = poly_calc(&dv,local_a8);
      dVar15 = local_a8 - dVar15 / dVar16;
      auVar22 = ZEXT864((ulong)dVar15);
      g = dVar15;
      if ((dVar15 < -10000000000.0) || (10000000000.0 < dVar15)) break;
    }
    if ((dVar15 < -10000000000.0) || (10000000000.0 < dVar15)) {
      iVar9 = iVar9 + 1;
    }
    else {
      local_a8 = dVar15;
      auVar22._0_8_ = poly_calc(v,dVar15);
      auVar22._8_56_ = extraout_var;
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar13 = vandpd_avx512vl(auVar22._0_16_,auVar5);
      if (auVar13._0_8_ <= eps) {
        if ((local_b0 <= local_a8) && (local_a8 <= local_b8)) {
          std::vector<double,_std::allocator<double>_>::push_back(local_a0,&g);
        }
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   &nx.super__Vector_base<double,_std::allocator<double>_>,
                   (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3,&local_c1);
        pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar8 = (ulong)((long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar3) >> 3 &
                     0xffffffff; 1 < (int)uVar8; uVar8 = uVar8 - 1) {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = pdVar3[uVar8 - 1];
          nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar8 - 1] = pdVar3[uVar8 - 1];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = g;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar3[uVar8 - 2];
          auVar13 = vfmadd213sd_fma(auVar21,auVar18,auVar1);
          pdVar3[uVar8 - 2] = auVar13._0_8_;
        }
        pdVar3 = nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
        if (pdVar3 != nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          memmove(nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,pdVar3,
                  (long)nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar3);
        }
        nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = nx.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        std::vector<double,_std::allocator<double>_>::operator=
                  (v,(vector<double,_std::allocator<double>_> *)
                     &nx.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&nx.super__Vector_base<double,_std::allocator<double>_>);
        iVar9 = 0;
      }
      else {
        iVar9 = iVar9 + 2;
      }
    }
  } while (iVar9 < 0xe);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dv.super__Vector_base<double,_std::allocator<double>_>);
  return local_a0;
}

Assistant:

vector<double> poly_solve(vector<double> v, double l, double r, double eps = 1e-8) {
		static RNG_TYPE rng;
		vector<double> dv, s;
		int retry = 0, tat=0;
		while (v.size() > 1) {
			double mx = 0;
			for (auto t : v) mx = max(mx, fabs(t));
			if (mx)
			{
				for (auto& t : v) t /= mx;
			}
			dv = de(v);
			double g = l + randf(rng) * (r - l);
			++tat;
			if (tat % 5 == 0) g = l;
			else if (tat % 5 == 1) g = r;
			for (int j = 1; j <= 30; ++j) {
				g = g - poly_calc(v, g) / poly_calc(dv, g);
				if (g != g || g > 1e10 || g < -1e10)
					break;
			}
			if (g != g || g > 1e10 || g < -1e10) ++retry;
			else if (fabs(poly_calc(v, g)) > eps) retry += 2;
			else {
				retry = 0;
				if (g >= l && g <= r) s.push_back(g);
				vector<double> nx(v.size());
				//v/(x-g)
				for (int j = (int)v.size() - 1; j >= 1; --j) {
					nx[j] = v[j]; v[j - 1] += v[j] * g;
				}
				nx.erase(nx.begin()); v = nx;
			}
			if (retry >= 14) break;
		}
		return s;
		/*
		if (v.size() == 0)
			return vector<double>();
//		v = poly_normalized(v);
		vector<double> w = poly_solve(de(v), l, r, eps, false), o;
		w.insert(w.begin(), l);
		w.push_back(r);
		for (int j = 0; j + 1 < (int)w.size(); ++j) {
			double a = w[j], b = w[j+1], fa = poly_calc(v, a), fb = poly_calc(v, b);
			if (fabs(fa) < eps) {
				o.push_back(a);
				continue;
			}
			if (fabs(fb) < eps) {
				o.push_back(b);
				continue;
			}
			if ((fa > 0) == (fb > 0))
				continue;
			for (int k = 0; k < 100 && (a!=b); ++k) {
				double m = (a + b) / 2, fm = poly_calc(v, m);
				if ((fa > 0) ^ (fm > 0)) b = m, fb = fm;
				else a = m, fa = fm;
			}
			o.push_back(a);
		}
		if (verify)
		{
			vector<double> oo;
			for (auto g : o)
				if (fabs(poly_calc(v, g)) < eps) oo.push_back(g);
			o = oo;
		}
		return o;*/
	}